

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ConvertMeshes(DXFImporter *this,aiScene *pScene,FileData *output)

{
  pointer paVar1;
  mapped_type_conflict3 mVar2;
  pointer pBVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  mapped_type pBVar6;
  element_type *peVar7;
  _Base_ptr __n;
  pointer ppPVar8;
  pointer puVar9;
  PolyLine *pPVar10;
  pointer paVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  pointer pvVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  pointer pBVar19;
  Logger *this_00;
  mapped_type *ppBVar20;
  iterator iVar21;
  mapped_type_conflict3 *pmVar22;
  _Rb_tree_node_base *__s;
  aiMesh *paVar23;
  pointer ppPVar24;
  aiVector3D *__s_00;
  aiColor4D *__s_01;
  ulong *puVar25;
  aiFace *paVar26;
  uint *puVar27;
  uint *puVar28;
  long lVar29;
  runtime_error *prVar30;
  uint uVar31;
  FileData *extraout_RDX;
  ulong uVar32;
  FileData *pFVar33;
  FileData *extraout_RDX_00;
  Block *bl;
  mapped_type pBVar34;
  pointer psVar35;
  aiScene *pScene_00;
  pointer puVar36;
  aiFace *paVar37;
  ulong uVar38;
  string *this_01;
  string *__k;
  _Rb_tree_node_base *this_02;
  pointer puVar39;
  ulong uVar40;
  aiVector3D *paVar41;
  Block *bl_00;
  ulong uVar42;
  uint uVar43;
  _Base_ptr p_Var44;
  undefined1 auVar45 [16];
  vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_> pv;
  LayerMap layers;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  corr;
  BlockMap blocks_by_name;
  element_type *local_258;
  undefined8 uStack_250;
  long local_248 [3];
  aiScene *local_230;
  aiMesh *local_228;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_220;
  _Rb_tree_node_base *local_1f0;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  local_1e8;
  pointer local_1c8;
  pointer local_1c0;
  uint *local_1b8;
  element_type *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_230 = pScene;
  bVar16 = DefaultLogger::isNullLogger();
  if (!bVar16) {
    pBVar3 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pBVar19 = (output->blocks).
                   super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                   _M_impl.super__Vector_impl_data._M_start; pBVar19 != pBVar3;
        pBVar19 = pBVar19 + 1) {
      psVar4 = (pBVar19->lines).
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar35 = (pBVar19->lines).
                     super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar35 != psVar4;
          psVar35 = psVar35 + 1) {
        p_Var5 = (psVar35->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
      }
    }
    this_00 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[30]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [30])"DXF: Unexpanded polycount is ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,", vertex count is ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_00,(char *)local_220._M_impl._0_8_);
    if ((_Base_ptr *)local_220._M_impl._0_8_ !=
        &local_220._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_220._M_impl._0_8_,
                      (ulong)((long)&(local_220._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pBVar34 = (output->blocks).
            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar6 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar6 == pBVar34) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"DXF: no data blocks loaded","");
    std::runtime_error::runtime_error(prVar30,(string *)local_1a8);
    *(undefined ***)prVar30 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_198._8_8_ = local_1a8 + 8;
  local_1a8._8_4_ = _S_red;
  bl_00 = (Block *)0x0;
  local_198._M_allocated_capacity = 0;
  local_180 = 0;
  local_188 = (_Base_ptr)local_198._8_8_;
  do {
    __k = &pBVar34->name;
    this_01 = (string *)local_1a8;
    ppBVar20 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                             *)local_1a8,__k);
    *ppBVar20 = pBVar34;
    if (bl_00 == (Block *)0x0) {
      iVar17 = std::__cxx11::string::compare((char *)__k);
      this_01 = __k;
      bl_00 = (Block *)0x0;
      if (iVar17 == 0) {
        bl_00 = pBVar34;
      }
    }
    pBVar34 = pBVar34 + 1;
  } while (pBVar34 != pBVar6);
  if (bl_00 == (Block *)0x0) {
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_220._M_impl._0_8_ = &local_220._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,"DXF: no ENTITIES data block loaded","");
    std::runtime_error::runtime_error(prVar30,(string *)&local_220);
    *(undefined ***)prVar30 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_220._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_220._M_impl.super__Rb_tree_header._M_header;
  local_220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_220._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_220._M_impl.super__Rb_tree_header._M_header._M_right =
       local_220._M_impl.super__Rb_tree_header._M_header._M_left;
  ExpandBlockReferences((DXFImporter *)this_01,bl_00,(BlockMap *)local_1a8);
  psVar35 = (bl_00->lines).
            super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (bl_00->lines).
           super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar35 != psVar4) {
    mVar2 = 0;
    do {
      peVar7 = (psVar35->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var5 = (psVar35->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      if ((peVar7->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (peVar7->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&local_220,&peVar7->layer);
        if ((_Rb_tree_header *)iVar21._M_node == &local_220._M_impl.super__Rb_tree_header) {
          local_230->mNumMeshes = local_230->mNumMeshes + 1;
          pmVar22 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)&local_220,&peVar7->layer);
          *pmVar22 = mVar2;
          local_258 = (element_type *)0x0;
          uStack_250 = 0;
          local_248[0] = 0;
          local_1b0 = peVar7;
          std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
          emplace_back<Assimp::DXF::PolyLine_const*>
                    ((vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                      *)&local_258,&local_1b0);
          std::
          vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
          ::push_back(&local_1e8,(value_type *)&local_258);
          if (local_258 != (element_type *)0x0) {
            operator_delete(local_258,local_248[0] - (long)local_258);
          }
          mVar2 = mVar2 + 1;
        }
        else {
          local_258 = peVar7;
          std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
          emplace_back<Assimp::DXF::PolyLine_const*>
                    ((vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                      *)(local_1e8.
                         super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar21._M_node[2]._M_color),
                     (PolyLine **)&local_258);
        }
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      psVar35 = psVar35 + 1;
    } while (psVar35 != psVar4);
  }
  pScene_00 = local_230;
  if ((ulong)local_230->mNumMeshes != 0) {
    uVar42 = (ulong)local_230->mNumMeshes << 3;
    __s = (_Rb_tree_node_base *)operator_new__(uVar42);
    this_02 = __s;
    memset(__s,0,uVar42);
    pScene_00->mMeshes = (aiMesh **)__s;
    pFVar33 = extraout_RDX;
    p_Var44 = local_220._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_220._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_220._M_impl.super__Rb_tree_header) {
      do {
        paVar23 = (aiMesh *)operator_new(0x520);
        paVar23->mPrimitiveTypes = 0;
        paVar23->mNumVertices = 0;
        paVar23->mNumFaces = 0;
        memset(&paVar23->mVertices,0,0xcc);
        paVar23->mBones = (aiBone **)0x0;
        paVar23->mMaterialIndex = 0;
        (paVar23->mName).length = 0;
        (paVar23->mName).data[0] = '\0';
        memset((paVar23->mName).data + 1,0x1b,0x3ff);
        paVar23->mNumAnimMeshes = 0;
        paVar23->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar23->mMethod = 0;
        (paVar23->mAABB).mMin.x = 0.0;
        (paVar23->mAABB).mMin.y = 0.0;
        (paVar23->mAABB).mMin.z = 0.0;
        (paVar23->mAABB).mMax.x = 0.0;
        (paVar23->mAABB).mMax.y = 0.0;
        (paVar23->mAABB).mMax.z = 0.0;
        paVar23->mTextureCoords[0] = (aiVector3D *)0x0;
        paVar23->mTextureCoords[1] = (aiVector3D *)0x0;
        paVar23->mTextureCoords[2] = (aiVector3D *)0x0;
        paVar23->mTextureCoords[3] = (aiVector3D *)0x0;
        paVar23->mTextureCoords[4] = (aiVector3D *)0x0;
        paVar23->mTextureCoords[5] = (aiVector3D *)0x0;
        paVar23->mTextureCoords[6] = (aiVector3D *)0x0;
        paVar23->mTextureCoords[7] = (aiVector3D *)0x0;
        paVar23->mNumUVComponents[0] = 0;
        paVar23->mNumUVComponents[1] = 0;
        paVar23->mNumUVComponents[2] = 0;
        paVar23->mNumUVComponents[3] = 0;
        paVar23->mNumUVComponents[4] = 0;
        paVar23->mNumUVComponents[5] = 0;
        paVar23->mNumUVComponents[6] = 0;
        paVar23->mNumUVComponents[7] = 0;
        paVar23->mColors[0] = (aiColor4D *)0x0;
        paVar23->mColors[1] = (aiColor4D *)0x0;
        paVar23->mColors[2] = (aiColor4D *)0x0;
        paVar23->mColors[3] = (aiColor4D *)0x0;
        paVar23->mColors[4] = (aiColor4D *)0x0;
        paVar23->mColors[5] = (aiColor4D *)0x0;
        paVar23->mColors[6] = (aiColor4D *)0x0;
        paVar23->mColors[7] = (aiColor4D *)0x0;
        pScene_00->mMeshes[p_Var44[2]._M_color] = paVar23;
        __n = p_Var44[1]._M_parent;
        if (__n < (_Base_ptr)&DAT_00000400) {
          (paVar23->mName).length = (ai_uint32)__n;
          memcpy((paVar23->mName).data,*(void **)(p_Var44 + 1),(size_t)__n);
          (paVar23->mName).data[(long)__n] = '\0';
        }
        pvVar15 = local_1e8.
                  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar24 = local_1e8.
                   super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[p_Var44[2]._M_color].
                   super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppPVar8 = local_1e8.
                  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[p_Var44[2]._M_color].
                  super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppPVar24 == ppPVar8) {
          uVar42 = 0;
          uVar43 = 0;
        }
        else {
          uVar43 = 0;
          uVar42 = 0;
          do {
            puVar36 = ((*ppPVar24)->counts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar9 = ((*ppPVar24)->counts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            iVar17 = 0;
            if (puVar36 != puVar9) {
              iVar17 = 0;
              puVar39 = puVar36;
              do {
                iVar17 = iVar17 + *puVar39;
                puVar39 = puVar39 + 1;
              } while (puVar39 != puVar9);
            }
            uVar43 = uVar43 + iVar17;
            uVar42 = (ulong)(uint)((int)uVar42 + (int)((ulong)((long)puVar9 - (long)puVar36) >> 2));
            ppPVar24 = ppPVar24 + 1;
          } while (ppPVar24 != ppPVar8);
        }
        uVar32 = (ulong)uVar43;
        local_228 = paVar23;
        local_1f0 = p_Var44;
        __s_00 = (aiVector3D *)operator_new__(uVar32 * 0xc);
        if (uVar43 != 0) {
          memset(__s_00,0,((uVar32 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar23->mVertices = __s_00;
        __s_01 = (aiColor4D *)operator_new__(uVar32 << 4);
        if (uVar43 != 0) {
          memset(__s_01,0,uVar32 << 4);
        }
        local_228->mColors[0] = __s_01;
        puVar25 = (ulong *)operator_new__(uVar42 * 0x10 + 8);
        *puVar25 = uVar42;
        paVar37 = (aiFace *)(puVar25 + 1);
        if ((uint)uVar42 != 0) {
          paVar26 = paVar37;
          do {
            paVar26->mNumIndices = 0;
            paVar26->mIndices = (uint *)0x0;
            paVar26 = paVar26 + 1;
          } while (paVar26 != paVar37 + uVar42);
        }
        local_228->mFaces = paVar37;
        local_228->mNumVertices = uVar43;
        local_228->mNumFaces = (uint)uVar42;
        ppPVar24 = pvVar15[local_1f0[2]._M_color].
                   super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_1c8 = pvVar15[local_1f0[2]._M_color].
                    super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (ppPVar24 == local_1c8) {
          uVar43 = 0;
        }
        else {
          iVar17 = 0;
          uVar43 = 0;
          do {
            pPVar10 = *ppPVar24;
            puVar27 = (pPVar10->counts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_1b8 = (pPVar10->counts).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            local_1c0 = ppPVar24;
            if (puVar27 != local_1b8) {
              puVar36 = (pPVar10->indices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                uVar42 = (ulong)*puVar27;
                paVar37->mNumIndices = *puVar27;
                puVar28 = (uint *)operator_new__(uVar42 * 4);
                paVar37->mIndices = puVar28;
                if (uVar42 != 0) {
                  lVar29 = 0;
                  uVar32 = 0;
                  paVar41 = __s_00;
                  do {
                    paVar37->mIndices[uVar32] = iVar17 + (int)uVar32;
                    paVar11 = (pPVar10->positions).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar38 = ((long)(pPVar10->positions).
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar11 >> 2)
                             * -0x5555555555555555;
                    if (uVar38 - ((long)(pPVar10->colors).
                                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pPVar10->colors).
                                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) != 0) {
                      __assert_fail("pl->positions.size() == pl->colors.size()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/DXF/DXFLoader.cpp"
                                    ,0x14c,
                                    "void Assimp::DXFImporter::ConvertMeshes(aiScene *, DXF::FileData &)"
                                   );
                    }
                    uVar40 = (ulong)puVar36[uVar32];
                    if (uVar38 < uVar40 || uVar38 - uVar40 == 0) {
                      prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_258 = (element_type *)local_248;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_258,"DXF: vertex index out of bounds","");
                      std::runtime_error::runtime_error(prVar30,(string *)&local_258);
                      *(undefined ***)prVar30 = &PTR__runtime_error_008e3168;
                      __cxa_throw(prVar30,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    __s_00 = paVar41 + 1;
                    paVar41->z = paVar11[uVar40].z;
                    fVar12 = paVar11[uVar40].y;
                    paVar41->x = paVar11[uVar40].x;
                    paVar41->y = fVar12;
                    paVar1 = (pPVar10->colors).
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + puVar36[uVar32];
                    fVar12 = paVar1->g;
                    fVar13 = paVar1->b;
                    fVar14 = paVar1->a;
                    __s_01->r = paVar1->r;
                    __s_01->g = fVar12;
                    __s_01->b = fVar13;
                    __s_01->a = fVar14;
                    __s_01 = __s_01 + 1;
                    uVar32 = uVar32 + 1;
                    lVar29 = lVar29 + -4;
                    paVar41 = __s_00;
                  } while (uVar42 != uVar32);
                  iVar17 = iVar17 + (int)uVar32;
                  puVar36 = (pointer)((long)puVar36 - lVar29);
                }
                uVar31 = paVar37->mNumIndices - 1;
                uVar18 = 8;
                if (uVar31 < 3) {
                  uVar18 = *(uint *)(&DAT_007637d0 + (ulong)uVar31 * 4);
                }
                uVar43 = uVar43 | uVar18;
                paVar37 = paVar37 + 1;
                puVar27 = puVar27 + 1;
              } while (puVar27 != local_1b8);
            }
            ppPVar24 = local_1c0 + 1;
          } while (ppPVar24 != local_1c8);
        }
        local_228->mPrimitiveTypes = uVar43;
        local_228->mMaterialIndex = 0;
        this_02 = local_1f0;
        auVar45 = std::_Rb_tree_increment(local_1f0);
        pFVar33 = auVar45._8_8_;
        p_Var44 = auVar45._0_8_;
        pScene_00 = local_230;
      } while ((_Rb_tree_header *)p_Var44 != &local_220._M_impl.super__Rb_tree_header);
    }
    GenerateHierarchy((DXFImporter *)this_02,pScene_00,pFVar33);
    GenerateMaterials((DXFImporter *)this_02,pScene_00,extraout_RDX_00);
    std::
    vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
    ::~vector(&local_1e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_220);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                 *)local_1a8);
    return;
  }
  prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_258 = (element_type *)local_248;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"DXF: this file contains no 3d data","");
  std::runtime_error::runtime_error(prVar30,(string *)&local_258);
  *(undefined ***)prVar30 = &PTR__runtime_error_008e3168;
  __cxa_throw(prVar30,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DXFImporter::ConvertMeshes(aiScene* pScene, DXF::FileData& output) {
    // the process of resolving all the INSERT statements can grow the
    // poly-count excessively, so log the original number.
    // XXX Option to import blocks as separate nodes?
    if (!DefaultLogger::isNullLogger()) {
        unsigned int vcount = 0, icount = 0;
        for (const DXF::Block& bl : output.blocks) {
            for (std::shared_ptr<const DXF::PolyLine> pl : bl.lines) {
                vcount += static_cast<unsigned int>(pl->positions.size());
                icount += static_cast<unsigned int>(pl->counts.size());
            }
        }

        ASSIMP_LOG_DEBUG_F("DXF: Unexpanded polycount is ", icount, ", vertex count is ", vcount);
    }

    if (! output.blocks.size()  ) {
        throw DeadlyImportError("DXF: no data blocks loaded");
    }

    DXF::Block* entities( nullptr );

    // index blocks by name
    DXF::BlockMap blocks_by_name;
    for (DXF::Block& bl : output.blocks) {
        blocks_by_name[bl.name] = &bl;
        if ( !entities && bl.name == AI_DXF_ENTITIES_MAGIC_BLOCK ) {
            entities = &bl;
        }
    }

    if (!entities) {
        throw DeadlyImportError("DXF: no ENTITIES data block loaded");
    }

    typedef std::map<std::string, unsigned int> LayerMap;

    LayerMap layers;
    std::vector< std::vector< const DXF::PolyLine*> > corr;

    // now expand all block references in the primary ENTITIES block
    // XXX this involves heavy memory copying, consider a faster solution for future versions.
    ExpandBlockReferences(*entities,blocks_by_name);

    unsigned int cur = 0;
    for (std::shared_ptr<const DXF::PolyLine> pl : entities->lines) {
        if (pl->positions.size()) {

            std::map<std::string, unsigned int>::iterator it = layers.find(pl->layer);
            if (it == layers.end()) {
                ++pScene->mNumMeshes;

                layers[pl->layer] = cur++;

                std::vector< const DXF::PolyLine* > pv;
                pv.push_back(&*pl);

                corr.push_back(pv);
            }
            else {
                corr[(*it).second].push_back(&*pl);
            }
        }
    }

    if ( 0 == pScene->mNumMeshes) {
        throw DeadlyImportError("DXF: this file contains no 3d data");
    }

    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ] ();

    for(const LayerMap::value_type& elem : layers){
        aiMesh* const mesh =  pScene->mMeshes[elem.second] = new aiMesh();
        mesh->mName.Set(elem.first);

        unsigned int cvert = 0,cface = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){
            // sum over all faces since we need to 'verbosify' them.
            cvert += std::accumulate(pl->counts.begin(),pl->counts.end(),0);
            cface += static_cast<unsigned int>(pl->counts.size());
        }

        aiVector3D* verts = mesh->mVertices = new aiVector3D[cvert];
        aiColor4D* colors = mesh->mColors[0] = new aiColor4D[cvert];
        aiFace* faces = mesh->mFaces = new aiFace[cface];

        mesh->mNumVertices = cvert;
        mesh->mNumFaces = cface;

        unsigned int prims = 0;
        unsigned int overall_indices = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){

            std::vector<unsigned int>::const_iterator it = pl->indices.begin();
            for(unsigned int facenumv : pl->counts) {
                aiFace& face = *faces++;
                face.mIndices = new unsigned int[face.mNumIndices = facenumv];

                for (unsigned int i = 0; i < facenumv; ++i) {
                    face.mIndices[i] = overall_indices++;

                    ai_assert(pl->positions.size() == pl->colors.size());
                    if (*it >= pl->positions.size()) {
                        throw DeadlyImportError("DXF: vertex index out of bounds");
                    }

                    *verts++ = pl->positions[*it];
                    *colors++ = pl->colors[*it++];
                }

                // set primitive flags now, this saves the extra pass in ScenePreprocessor.
                switch(face.mNumIndices) {
                    case 1:
                        prims |= aiPrimitiveType_POINT;
                        break;
                    case 2:
                        prims |= aiPrimitiveType_LINE;
                        break;
                    case 3:
                        prims |= aiPrimitiveType_TRIANGLE;
                        break;
                    default:
                        prims |= aiPrimitiveType_POLYGON;
                        break;
                }
            }
        }

        mesh->mPrimitiveTypes = prims;
        mesh->mMaterialIndex = 0;
    }

    GenerateHierarchy(pScene,output);
    GenerateMaterials(pScene,output);
}